

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O0

void __thiscall FRandom::InitGenRand(FRandom *this,DWORD seed)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int local_18;
  int i;
  DWORD seed_local;
  FRandom *this_local;
  
  iVar3 = idxof(0);
  *(DWORD *)((long)&this->sfmt + (long)iVar3 * 4) = seed;
  for (local_18 = 1; local_18 < 0x14; local_18 = local_18 + 1) {
    iVar3 = idxof(local_18 + -1);
    uVar1 = *(uint *)((long)&this->sfmt + (long)iVar3 * 4);
    iVar3 = idxof(local_18 + -1);
    uVar2 = *(uint *)((long)&this->sfmt + (long)iVar3 * 4);
    iVar3 = idxof(local_18);
    *(uint *)((long)&this->sfmt + (long)iVar3 * 4) = (uVar1 ^ uVar2 >> 0x1e) * 0x6c078965 + local_18
    ;
  }
  this->idx = 0x14;
  PeriodCertification(this);
  this->initialized = true;
  return;
}

Assistant:

void FRandom::InitGenRand(DWORD seed)
{
	int i;

	sfmt.u[idxof(0)] = seed;
	for (i = 1; i < SFMT::N32; i++)
	{
		sfmt.u[idxof(i)] = 1812433253UL * (sfmt.u[idxof(i - 1)] 
		^ (sfmt.u[idxof(i - 1)] >> 30))
			+ i;
	}
	idx = SFMT::N32;
	PeriodCertification();
#ifndef NDEBUG
	initialized = 1;
#endif
}